

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

ostream * wasm::operator<<(ostream *o,Literal *literal)

{
  long *plVar1;
  array<wasm::Literal,_1UL> *this;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *this_00;
  ulong uVar2;
  bool bVar3;
  Shareability SVar4;
  uint uVar5;
  HeapTypeKind HVar6;
  int32_t iVar7;
  long lVar8;
  ostream *poVar9;
  Literal *pLVar10;
  int64_t iVar11;
  undefined8 in_RCX;
  HeapType HVar12;
  long lVar13;
  Literal *other;
  char *pcVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  Name NVar16;
  string_view str;
  Name name;
  undefined1 local_260 [8];
  stringstream wtf16;
  ostream local_250 [112];
  ios_base local_1e0 [264];
  Literals local_d8;
  undefined1 local_a0 [8];
  shared_ptr<wasm::GCData> data;
  undefined1 local_78 [8];
  value_type c;
  HeapType local_58;
  HeapType heapType;
  char local_31;
  
  lVar8 = __tls_get_addr(&PTR_01079ea8);
  plVar1 = (long *)(lVar8 + 0x818);
  lVar8 = *plVar1;
  *plVar1 = lVar8 + 1;
  Colors::outputColorCode(o,"\x1b[33m");
  uVar2 = (literal->type).id;
  if ((uVar2 < 2) ||
     (pcVar14 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),uVar2 < 7),
     (uVar2 & 1) != 0 && uVar2 >= 7)) {
    __assert_fail("literal.type.isSingle()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0x25e,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
  }
  if (uVar2 < 7) {
    poVar9 = (ostream *)
             (*(code *)(&DAT_00e2be0c + *(int *)(&DAT_00e2be0c + (ulong)((int)uVar2 - 2) * 4)))();
    return poVar9;
  }
  if ((uVar2 & 1) != 0) {
    __assert_fail("literal.type.isRef()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0x278,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
  }
  local_58 = Type::getHeapType(&literal->type);
  SVar4 = HeapType::getShared(&local_58);
  if (SVar4 == Shared) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"shared ",7);
  }
  if (0x7c < local_58.id) {
    HVar6 = HeapType::getKind(&local_58);
    if (HVar6 != Func) {
      bVar3 = Type::isData(&literal->type);
      if (!bVar3) {
        __assert_fail("literal.isData()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                      ,0x2b9,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
      }
      Literal::getGCData((Literal *)local_260);
      if (local_260 == (undefined1  [8])0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                      ,699,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,"[ref ",5);
      poVar9 = operator<<(o,(HeapType)((HeapType *)local_260)->id);
      local_78[0] = ' ';
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_78,1);
      local_d8.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (((Literals *)((long)local_260 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
      this = &local_d8.super_SmallVector<wasm::Literal,_1UL>.fixed;
      Literal::Literal(this->_M_elems,
                       (((Literals *)((long)local_260 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                       fixed._M_elems);
      this_00 = &local_d8.super_SmallVector<wasm::Literal,_1UL>.flexible;
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                (this_00,&(((Literals *)((long)local_260 + 8))->
                          super_SmallVector<wasm::Literal,_1UL>).flexible);
      poVar9 = operator<<(poVar9,&local_d8);
      local_78[0] = ']';
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_78,1);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(this_00);
      Literal::~Literal(this->_M_elems);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_wtf16 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_wtf16);
      }
      goto switchD_00c30eda_default;
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,"funcref(",8);
    NVar16 = Literal::getFunc(literal);
    name.super_IString.str._M_len = NVar16.super_IString.str._M_str;
    name.super_IString.str._M_str = pcVar14;
    poVar9 = operator<<((wasm *)o,NVar16.super_IString.str._M_len,name);
LAB_00c310a9:
    lVar13 = 1;
    pcVar14 = ")";
    goto LAB_00c312cb;
  }
  uVar5 = (uint)local_58.id & 0x7b;
  poVar9 = o;
  switch(uVar5 << 0x1d | uVar5 - 8 >> 3) {
  case 0:
    lVar13 = 9;
    pcVar14 = "externref";
    break;
  case 1:
  case 2:
  case 4:
  case 6:
  case 7:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x29c);
  case 3:
  case 9:
    Literal::getGCData((Literal *)local_a0);
    heapType.id = (uintptr_t)local_a0;
    if (local_a0 == (undefined1  [8])0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"nullstring",10);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(o,"string(",7);
      std::__cxx11::stringstream::stringstream((stringstream *)local_260);
      data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((*(long *)(heapType.id + 0x30) - *(long *)(heapType.id + 0x28) >> 3) *
            -0x5555555555555555 + *(long *)(heapType.id + 8));
      HVar12 = heapType;
      if (data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pLVar10 = (Literal *)(heapType.id + 0x10);
        lVar13 = -0x18;
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        do {
          other = (Literal *)(*(long *)(heapType.id + 0x28) + lVar13);
          if (p_Var15 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            other = pLVar10;
          }
          Literal::Literal((Literal *)local_78,other);
          iVar11 = Literal::getInteger((Literal *)local_78);
          if (0xffff < iVar11) {
            __assert_fail("u < 0x10000",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                          ,0x2a9,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
          }
          local_31 = (char)iVar11;
          std::__ostream_insert<char,std::char_traits<char>>(local_250,&local_31,1);
          local_31 = (char)((ulong)iVar11 >> 8);
          std::__ostream_insert<char,std::char_traits<char>>(local_250,&local_31,1);
          Literal::~Literal((Literal *)local_78);
          p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&p_Var15->_vptr__Sp_counted_base + 1);
          lVar13 = lVar13 + 0x18;
        } while (data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 != p_Var15);
      }
      std::__cxx11::stringbuf::str();
      str._M_len._1_7_ = local_78._1_7_;
      str._M_len._0_1_ = local_78[0];
      str._M_str = (char *)HVar12.id;
      String::printEscapedJSON
                ((String *)o,
                 (ostream *)
                 c.field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,str);
      if ((void *)CONCAT71(local_78._1_7_,local_78[0]) != (void *)((long)&c.field_0 + 8)) {
        operator_delete((void *)CONCAT71(local_78._1_7_,local_78[0]),
                        (ulong)(c.field_0.func.super_IString.str._M_str + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,")",1);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_260);
      std::ios_base::~ios_base(local_1e0);
    }
    if (data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    goto switchD_00c30eda_default;
  case 5:
    std::__ostream_insert<char,std::char_traits<char>>(o,"i31ref(",7);
    iVar7 = Literal::geti31(literal,true);
    poVar9 = (ostream *)std::ostream::operator<<(o,iVar7);
    goto LAB_00c310a9;
  case 8:
    lVar13 = 6;
    pcVar14 = "exnref";
    break;
  case 10:
    lVar13 = 7;
    pcVar14 = "nullref";
    break;
  case 0xb:
    lVar13 = 0xd;
    pcVar14 = "nullexternref";
    break;
  case 0xc:
    lVar13 = 0xb;
    pcVar14 = "nullfuncref";
    break;
  case 0xd:
    lVar13 = 0xb;
    pcVar14 = "nullcontref";
    break;
  case 0xe:
    lVar13 = 10;
    pcVar14 = "nullexnref";
    break;
  default:
    goto switchD_00c30eda_default;
  }
LAB_00c312cb:
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,lVar13);
switchD_00c30eda_default:
  Colors::outputColorCode(o,"\x1b[0m");
  if (lVar8 == 0) {
    *plVar1 = 0;
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, Literal literal) {
  PrintLimiter limiter;

  prepareMinorColor(o);
  assert(literal.type.isSingle());
  if (literal.type.isBasic()) {
    switch (literal.type.getBasic()) {
      case Type::none:
        o << "?";
        break;
      case Type::i32:
        o << literal.geti32();
        break;
      case Type::i64:
        o << literal.geti64();
        break;
      case Type::f32:
        literal.printFloat(o, literal.getf32());
        break;
      case Type::f64:
        literal.printDouble(o, literal.getf64());
        break;
      case Type::v128:
        o << "i32x4 ";
        literal.printVec128(o, literal.getv128());
        break;
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  } else {
    assert(literal.type.isRef());
    auto heapType = literal.type.getHeapType();
    if (heapType.isShared()) {
      o << "shared ";
    }
    if (heapType.isBasic()) {
      switch (heapType.getBasic(Unshared)) {
        case HeapType::i31:
          o << "i31ref(" << literal.geti31() << ")";
          break;
        case HeapType::none:
          o << "nullref";
          break;
        case HeapType::noext:
          o << "nullexternref";
          break;
        case HeapType::nofunc:
          o << "nullfuncref";
          break;
        case HeapType::noexn:
          o << "nullexnref";
          break;
        case HeapType::nocont:
          o << "nullcontref";
          break;
        case HeapType::ext:
          o << "externref";
          break;
        case HeapType::exn:
          o << "exnref";
          break;
        case HeapType::eq:
        case HeapType::func:
        case HeapType::cont:
        case HeapType::struct_:
        case HeapType::array:
          WASM_UNREACHABLE("invalid type");
        case HeapType::any:
          // Anyref literals contain strings.
        case HeapType::string: {
          auto data = literal.getGCData();
          if (!data) {
            o << "nullstring";
          } else {
            o << "string(";
            // Convert WTF-16 literals to WTF-16 string.
            std::stringstream wtf16;
            for (auto c : data->values) {
              auto u = c.getInteger();
              assert(u < 0x10000);
              wtf16 << uint8_t(u & 0xFF);
              wtf16 << uint8_t(u >> 8);
            }
            // Escape to ensure we have valid unicode output and to make
            // unprintable characters visible.
            // TODO: Use wtf16.view() once we have C++20.
            String::printEscapedJSON(o, wtf16.str());
            o << ")";
          }
          break;
        }
      }
    } else if (heapType.isSignature()) {
      o << "funcref(" << literal.getFunc() << ")";
    } else {
      assert(literal.isData());
      auto data = literal.getGCData();
      assert(data);
      o << "[ref " << data->type << ' ' << data->values << ']';
    }
  }
  restoreNormalColor(o);
  return o;
}